

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

void splitStr(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *rez,char *str,char splitter)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *prevPos;
  char *local_40;
  long local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(rez,(rez->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  cVar2 = *str;
  if (cVar2 != '\0') {
    pcVar1 = str + 1;
    pcVar4 = str;
    local_40 = str;
    do {
      pcVar3 = pcVar1;
      if (cVar2 == splitter) {
        local_38 = (long)str - (long)pcVar4;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,long>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rez,
                   &local_40,&local_38);
        pcVar4 = pcVar3;
        local_40 = pcVar3;
      }
      cVar2 = *pcVar3;
      str = str + 1;
      pcVar1 = pcVar3 + 1;
    } while (cVar2 != '\0');
    if (pcVar4 < pcVar3) {
      local_38 = (long)str - (long)pcVar4;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rez,&local_40,
                 &local_38);
    }
  }
  return;
}

Assistant:

void splitStr(vector<string>& rez, const char* str, const char splitter)
{
    rez.clear();
    const char* prevPos = str;
    const char* buf = str;
    for (; *buf; buf++)
    {
        if (*buf == splitter)
        {
            rez.emplace_back(prevPos, buf - prevPos);
            prevPos = buf + 1;
        }
    }
    if (buf > prevPos)
        rez.emplace_back(prevPos, buf - prevPos);
}